

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O2

bool port_is_enabled(Port *port,char *loc,size_t loc_size,Ports *base,void *runtime,
                    bool relative_to_parent,port_walker_t walker,void *data)

{
  char cVar1;
  char cVar2;
  undefined8 uVar3;
  char *pcVar4;
  long lVar5;
  Port *pPVar6;
  size_t sVar7;
  char *__s;
  char *pcVar8;
  bool bVar9;
  char *pcVar10;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  Ports *this;
  char *dest;
  byte bVar16;
  char acStack_b0 [8];
  size_t sStack_a8;
  long lStack_a0;
  char acStack_98 [8];
  char acStack_90 [16];
  MetaContainer local_80;
  rtosc_arg_val_t rval;
  
  bVar9 = true;
  if (runtime != (void *)0x0 && port != (Port *)0x0) {
    builtin_strncpy(acStack_90,"\x1bc\x10",4);
    acStack_90[4] = '\0';
    acStack_90[5] = '\0';
    acStack_90[6] = '\0';
    acStack_90[7] = '\0';
    rval.val.b.data = (uint8_t *)loc_size;
    local_80 = rtosc::Port::meta(port);
    builtin_strncpy(acStack_90,".c\x10",4);
    acStack_90[4] = '\0';
    acStack_90[5] = '\0';
    acStack_90[6] = '\0';
    acStack_90[7] = '\0';
    pcVar4 = rtosc::Port::MetaContainer::operator[](&local_80,"enabled by");
    if (pcVar4 != (char *)0x0) {
      lVar5 = 0;
      while( true ) {
        cVar1 = port->name[lVar5];
        bVar16 = 1;
        pcVar10 = pcVar4;
        this = base;
        if (cVar1 == '\0') break;
        cVar2 = pcVar4[lVar5];
        if (((cVar2 == '/') || (cVar1 == '/')) || (cVar1 != cVar2)) {
          if (cVar1 == '/' && cVar2 == '/') {
            acStack_90[0] = -0x71;
            acStack_90[1] = 'c';
            acStack_90[2] = '\x10';
            acStack_90[3] = '\0';
            acStack_90[4] = '\0';
            acStack_90[5] = '\0';
            acStack_90[6] = '\0';
            acStack_90[7] = '\0';
            pPVar6 = rtosc::Ports::operator[](base,port->name);
            bVar16 = 0;
            pcVar10 = pcVar4 + lVar5 + 1;
            this = pPVar6->ports;
          }
          break;
        }
        lVar5 = lVar5 + 1;
      }
      acStack_90[0] = -0x62;
      acStack_90[1] = 'c';
      acStack_90[2] = '\x10';
      acStack_90[3] = '\0';
      acStack_90[4] = '\0';
      acStack_90[5] = '\0';
      acStack_90[6] = '\0';
      acStack_90[7] = '\0';
      pPVar6 = rtosc::Ports::operator[](this,pcVar10);
      acStack_90[0] = -0x56;
      acStack_90[1] = 'c';
      acStack_90[2] = '\x10';
      acStack_90[3] = '\0';
      acStack_90[4] = '\0';
      acStack_90[5] = '\0';
      acStack_90[6] = '\0';
      acStack_90[7] = '\0';
      sVar7 = strlen(loc);
      uVar3 = rval.val.b.data;
      lVar5 = -((ulong)(rval.val.b.data + 0xf) & 0xfffffffffffffff0);
      pcVar10 = acStack_90 + lVar5 + 8;
      pcVar12 = acStack_90 + lVar5;
      pcVar12[0] = -0x2c;
      pcVar12[1] = 'c';
      pcVar12[2] = '\x10';
      pcVar12[3] = '\0';
      pcVar12[4] = '\0';
      pcVar12[5] = '\0';
      pcVar12[6] = '\0';
      pcVar12[7] = '\0';
      strcpy(pcVar10,loc);
      uVar11 = (ulong)(int)sVar7;
      if (relative_to_parent) {
        pcVar13 = acStack_90 + lVar5;
        pcVar13[0] = -0xb;
        pcVar13[1] = 'c';
        pcVar13[2] = '\x10';
        pcVar13[3] = '\0';
        pcVar13[4] = '\0';
        pcVar13[5] = '\0';
        pcVar13[6] = '\0';
        pcVar13[7] = '\0';
        strncat(pcVar10,"../",(size_t)(uVar3 + ~uVar11));
      }
      pcVar14 = acStack_90 + lVar5;
      builtin_strncpy(acStack_90 + lVar5,"\x12d\x10",4);
      pcVar14[4] = '\0';
      pcVar14[5] = '\0';
      pcVar14[6] = '\0';
      pcVar14[7] = '\0';
      strncat(pcVar10,pcVar4,(size_t)(uVar3 + (-4 - uVar11)));
      pcVar15 = acStack_90 + lVar5;
      builtin_strncpy(acStack_90 + lVar5,"\x1ad\x10",4);
      pcVar15[4] = '\0';
      pcVar15[5] = '\0';
      pcVar15[6] = '\0';
      pcVar15[7] = '\0';
      __s = rtosc::Ports::collapsePath(pcVar10);
      dest = pcVar10 + -((ulong)(uVar3 + ((long)pcVar10 - (long)__s) + 0xf) & 0xfffffffffffffff0);
      dest[-8] = '/';
      dest[-7] = '\0';
      dest[-6] = '\0';
      dest[-5] = '\0';
      dest[-4] = '\0';
      dest[-3] = '\0';
      dest[-2] = '\0';
      dest[-1] = '\0';
      builtin_strncpy(acStack_90 +
                      -((ulong)(uVar3 + ((long)pcVar10 - (long)__s) + 0xf) & 0xfffffffffffffff0) +
                      lVar5,"Fd\x10",4);
      dest[-4] = '\0';
      dest[-3] = '\0';
      dest[-2] = '\0';
      dest[-1] = '\0';
      pcVar8 = strrchr(__s,(int)*(undefined8 *)(dest + -8));
      pcVar4 = pcVar8 + 1;
      if (pcVar8 == (char *)0x0) {
        pcVar4 = __s;
      }
      dest[-8] = '\\';
      dest[-7] = 'd';
      dest[-6] = '\x10';
      dest[-5] = '\0';
      dest[-4] = '\0';
      dest[-3] = '\0';
      dest[-2] = '\0';
      dest[-1] = '\0';
      fast_strcpy(dest,pcVar4,(size_t)(uVar3 + ((long)pcVar10 - (long)__s)));
      dest[-0x10] = '\0';
      dest[-0xf] = '\0';
      dest[-0xe] = '\0';
      dest[-0xd] = '\0';
      dest[-0xc] = '\0';
      dest[-0xb] = '\0';
      dest[-10] = '\0';
      dest[-9] = '\0';
      *(MetaContainer **)(dest + -0x18) = &local_80;
      dest[-0x20] = '\x01';
      dest[-0x1f] = '\0';
      dest[-0x1e] = '\0';
      dest[-0x1d] = '\0';
      dest[-0x1c] = '\0';
      dest[-0x1b] = '\0';
      dest[-0x1a] = '\0';
      dest[-0x19] = '\0';
      dest[-0x28] = -0x7b;
      dest[-0x27] = 'd';
      dest[-0x26] = '\x10';
      dest[-0x25] = '\0';
      dest[-0x24] = '\0';
      dest[-0x23] = '\0';
      dest[-0x22] = '\0';
      dest[-0x21] = '\0';
      rtosc::helpers::get_value_from_runtime
                (runtime,pPVar6,(size_t)(uVar3 + ((long)pcVar10 - (long)__s)),__s,dest,0x2000,
                 *(size_t *)(dest + -0x20),*(rtosc_arg_val_t **)(dest + -0x18),
                 *(vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                   **)(dest + -0x10));
      bVar9 = (char)local_80.str_ptr == 'T' || rval._0_4_ != 0 && (char)local_80.str_ptr == 'i';
      if ((((relative_to_parent & bVar16) == 0) && (walker != (port_walker_t)0x0)) &&
         ((char)local_80.str_ptr != 'T' && (rval._0_4_ == 0 || (char)local_80.str_ptr != 'i'))) {
        dest[-8] = -0x2c;
        dest[-7] = 'd';
        dest[-6] = '\x10';
        dest[-5] = '\0';
        dest[-4] = '\0';
        dest[-3] = '\0';
        dest[-2] = '\0';
        dest[-1] = '\0';
        (*walker)(pPVar6,__s,pcVar10 + uVar11 + 3,base,data,runtime);
      }
    }
  }
  return bVar9;
}

Assistant:

bool port_is_enabled(const Port* port, char* loc, size_t loc_size,
                     const Ports& base, void *runtime,
                     bool relative_to_parent,
                     port_walker_t walker, void* data)
{
    // TODO: this code should be improved
    if(port && runtime)
    {
        const char* enable_port = port->meta()["enabled by"];
        if(enable_port)
        {
            /*
                find out which Ports object to dispatch at
                (the current one or its child?)
             */
            const char* n = port->name;
            const char* e = enable_port;
            for( ; *n && (*n == *e) && *n != '/' && *e != '/'; ++n, ++e) ;

            bool subport = (*e == '/' && *n == '/');

            const char* ask_port_str = subport
                                       ? e+1
                                       : enable_port;

            const Ports& ask_ports = subport ? *base[port->name]->ports
                                             : base;

            assert(!strchr(ask_port_str, '/'));
            const Port* ask_port = ask_ports[ask_port_str];
            assert(ask_port);

            rtosc_arg_val_t rval;

            /*
                concatenate the location string
             */
            int loclen = strlen(loc);
            STACKALLOC(char, loc_copy, loc_size);
            strcpy(loc_copy, loc); // TODO: clang says strcpy is insecure
            if(relative_to_parent)
                strncat(loc_copy, "../", loc_size - loclen - 1);
            strncat(loc_copy, enable_port, loc_size - loclen - 3 - 1);

            char* collapsed_loc = Ports::collapsePath(loc_copy);
            loc_size -= (collapsed_loc - loc_copy);

            /*
                receive the "enabled" property
             */
            STACKALLOC(char, buf, loc_size);
            // TODO: pass a parameter portname_from_base, since Ports might
            //       also be of type a#N/b
            const char* last_slash = strrchr(collapsed_loc, '/');
            fast_strcpy(buf, last_slash ? last_slash + 1 : collapsed_loc,
                        loc_size); // TODO: bug: VoicePar#8/Enabled

            helpers::get_value_from_runtime(runtime,
                *ask_port, loc_size, collapsed_loc, buf,
                8192, 1, &rval, nullptr);
            assert(rval.type == 'T' || rval.type == 'F' || rval.type == 'i');

            bool res = rval.type == 'T' || (rval.type == 'i' && rval.val.i != 0);
            /*
             * If called from walk_ports, an enabling port must always be
             * traversed. However, if such a port resides inside a the port
             * which it currently disables, walk_ports would normally *not*
             * traverse it. So this allows still running walk_ports.
             */
            if (walker && !res && (subport || !relative_to_parent)) {
                // this makes some assumptions on how Ports::collapsePath works:
                // it starts at the end and keeps the string unchanged until the
                // first ".." - so we get:
                //    <loclen><4->
                //    /loc/abc/../enable
                //            abc/enable
                //
                const char* old_end = loc_copy + loclen + 3;
                walker(ask_port, collapsed_loc, old_end, base, data, runtime);
            }

            return res;
        }
        else // Port has no "enabled" property, so it is always enabled
            return true;
    }
    else // no runtime provided, so run statically through all subports
        return true;
}